

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O3

StreamIn * prvTidyBufferInput(TidyDocImpl *doc,TidyBuffer *buf,int encoding)

{
  TidyAllocator *pTVar1;
  StreamIn *__s;
  tchar *ptVar2;
  
  __s = (StreamIn *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x160);
  memset(__s,0,0x158);
  __s->curcol = 1;
  __s->curline = 1;
  __s->encoding = encoding;
  __s->doc = doc;
  __s->bufsize = 5;
  pTVar1 = doc->allocator;
  __s->allocator = pTVar1;
  ptVar2 = (tchar *)(*pTVar1->vtbl->alloc)(pTVar1,0x14);
  __s->charbuf = ptVar2;
  __s->curlastpos = 0;
  __s->firstlastpos = 0;
  tidyInitInputBuffer(&__s->source,buf);
  __s->iotype = BufferIO;
  return __s;
}

Assistant:

StreamIn* TY_(BufferInput)( TidyDocImpl* doc, TidyBuffer* buf, int encoding )
{
    StreamIn *in = TY_(initStreamIn)( doc, encoding );
    tidyInitInputBuffer( &in->source, buf );
    in->iotype = BufferIO;
    return in;
}